

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_dummy_when
                 (lyd_node *first,lyd_node *parent,lysc_node *snode,lysc_when **disabled)

{
  lyd_node_inner *plVar1;
  LY_ERR LVar2;
  lyd_node *tree;
  lyd_node_inner *node;
  lyd_node *dummy;
  lyd_node *local_38;
  
  dummy = (lyd_node *)0x0;
  plVar1 = (lyd_node_inner *)parent;
  node = (lyd_node_inner *)first;
  if (parent != (lyd_node *)0x0) {
    do {
      node = plVar1;
      plVar1 = *(lyd_node_inner **)((long)&node->field_0 + 0x10);
    } while (*(lyd_node_inner **)((long)&node->field_0 + 0x10) != (lyd_node_inner *)0x0);
  }
  tree = lyd_first_sibling((lyd_node *)node);
  local_38 = tree;
  LVar2 = lyd_new_opaq(parent,snode->module->ctx,snode->name,(char *)0x0,(char *)0x0,
                       snode->module->name,&dummy);
  if (LVar2 == LY_SUCCESS) {
    if (parent == (lyd_node *)0x0) {
      if (first == (lyd_node *)0x0) {
        if (tree != (lyd_node *)0x0) {
          __assert_fail("!tree",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                        ,0x40e,
                        "LY_ERR lyd_validate_dummy_when(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, const struct lysc_when **)"
                       );
        }
        local_38 = dummy;
        tree = dummy;
      }
      else {
        lyd_insert_sibling(first,dummy,&local_38);
        tree = local_38;
      }
    }
    LVar2 = lyd_validate_node_when(tree,dummy,snode,(snode->flags & 1) * 0x80 + 0x80,disabled);
    if (LVar2 == LY_EINCOMPLETE) {
      LVar2 = LY_EINT;
      ly_log(snode->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c",
             0x41e);
    }
  }
  lyd_free_tree(dummy);
  return LVar2;
}

Assistant:

static LY_ERR
lyd_validate_dummy_when(const struct lyd_node *first, const struct lyd_node *parent, const struct lysc_node *snode,
        const struct lysc_when **disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *tree, *dummy = NULL;
    uint32_t xp_opts;

    /* find root */
    if (parent) {
        tree = (struct lyd_node *)parent;
        while (tree->parent) {
            tree = lyd_parent(tree);
        }
        tree = lyd_first_sibling(tree);
    } else {
        /* is the first sibling from the same module, but may not be the actual first */
        tree = lyd_first_sibling(first);
    }

    /* create dummy opaque node */
    rc = lyd_new_opaq((struct lyd_node *)parent, snode->module->ctx, snode->name, NULL, NULL, snode->module->name, &dummy);
    LY_CHECK_GOTO(rc, cleanup);

    /* connect it if needed */
    if (!parent) {
        if (first) {
            lyd_insert_sibling((struct lyd_node *)first, dummy, &tree);
        } else {
            assert(!tree);
            tree = dummy;
        }
    }

    /* explicitly specified accesible tree */
    if (snode->flags & LYS_CONFIG_W) {
        xp_opts = LYXP_ACCESS_TREE_CONFIG;
    } else {
        xp_opts = LYXP_ACCESS_TREE_ALL;
    }

    /* evaluate all when */
    rc = lyd_validate_node_when(tree, dummy, snode, xp_opts, disabled);
    if (rc == LY_EINCOMPLETE) {
        /* all other when must be resolved by now */
        LOGINT(snode->module->ctx);
        rc = LY_EINT;
        goto cleanup;
    } else if (rc) {
        /* error */
        goto cleanup;
    }

cleanup:
    lyd_free_tree(dummy);
    return rc;
}